

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

void __thiscall llvm::APFloat::changeSign(APFloat *this)

{
  byte *pbVar1;
  fltSemantics *pfVar2;
  long lVar3;
  
  pfVar2 = (this->U).semantics;
  while (pfVar2 == (fltSemantics *)semPPCDoubleDouble) {
    changeSign((APFloat *)(this->U).IEEE.significand.parts);
    lVar3 = *(long *)((long)&this->U + 8);
    this = (APFloat *)(lVar3 + 0x20);
    pfVar2 = *(fltSemantics **)(lVar3 + 0x28);
  }
  pbVar1 = (byte *)((long)&this->U + 0x12);
  *pbVar1 = *pbVar1 ^ 8;
  return;
}

Assistant:

void changeSign() { APFLOAT_DISPATCH_ON_SEMANTICS(changeSign()); }